

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyze_live_input_pass.cpp
# Opt level: O2

Status __thiscall spvtools::opt::AnalyzeLiveInputPass::Process(AnalyzeLiveInputPass *this)

{
  bool bVar1;
  Status SVar2;
  FeatureManager *pFVar3;
  
  pFVar3 = IRContext::get_feature_mgr((this->super_Pass).context_);
  bVar1 = EnumSet<spv::Capability>::contains(&pFVar3->capabilities_,Shader);
  if (bVar1) {
    SVar2 = DoLiveInputAnalysis(this);
    return SVar2;
  }
  return SuccessWithoutChange;
}

Assistant:

Pass::Status AnalyzeLiveInputPass::Process() {
  // Current functionality assumes shader capability
  if (!context()->get_feature_mgr()->HasCapability(spv::Capability::Shader))
    return Status::SuccessWithoutChange;
  Pass::Status status = DoLiveInputAnalysis();
  return status;
}